

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_encoder.cpp
# Opt level: O1

idx_t __thiscall
duckdb::CSVEncoder::Encode
          (CSVEncoder *this,FileHandle *file_handle_input,char *output_buffer,
          idx_t decoded_buffer_size)

{
  optional_ptr<duckdb::EncodingFunction,_true> *this_00;
  EncodingFunction *pEVar1;
  ulong uVar2;
  idx_t iVar3;
  idx_t iVar4;
  reference pvVar5;
  int64_t iVar6;
  bool bVar7;
  ulong uVar8;
  char *pcVar9;
  idx_t i;
  size_type __n;
  idx_t unaff_R13;
  idx_t output_buffer_pos;
  vector<char,_true> pass_on_buffer;
  idx_t local_80;
  void *local_78;
  iterator iStack_70;
  char *local_68;
  CSVEncoderBuffer *local_60;
  idx_t local_58;
  FileHandle *local_50;
  char *local_48;
  idx_t *local_40;
  char *local_38;
  
  local_80 = 0;
  if ((this->remaining_bytes_buffer).cur_pos <
      (this->remaining_bytes_buffer).actual_encoded_buffer_size) {
    uVar8 = (this->remaining_bytes_buffer).cur_pos;
    if (uVar8 < (this->remaining_bytes_buffer).actual_encoded_buffer_size) {
      pcVar9 = (this->remaining_bytes_buffer).encoded_buffer._M_t.
               super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
               super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
               super__Head_base<0UL,_char_*,_false>._M_head_impl;
      uVar2 = 0;
      do {
        local_80 = uVar2 + 1;
        output_buffer[uVar2] = pcVar9[uVar8];
        uVar8 = (this->remaining_bytes_buffer).cur_pos + 1;
        (this->remaining_bytes_buffer).cur_pos = uVar8;
        uVar2 = local_80;
      } while (uVar8 < (this->remaining_bytes_buffer).actual_encoded_buffer_size);
    }
    (this->remaining_bytes_buffer).cur_pos = 0;
    (this->remaining_bytes_buffer).actual_encoded_buffer_size = 0;
  }
  local_60 = &this->encoded_buffer;
  local_58 = decoded_buffer_size;
  local_50 = file_handle_input;
  if ((this->encoded_buffer).cur_pos < (this->encoded_buffer).actual_encoded_buffer_size) {
    optional_ptr<duckdb::EncodingFunction,_true>::CheckValid(&this->encoding_function);
    pEVar1 = (this->encoding_function).ptr;
    (*pEVar1->encode_function)
              (local_60,output_buffer,&local_80,local_58,
               (this->remaining_bytes_buffer).encoded_buffer._M_t.
               super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
               super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
               super__Head_base<0UL,_char_*,_false>._M_head_impl,
               &(this->remaining_bytes_buffer).actual_encoded_buffer_size,pEVar1);
  }
  this_00 = &this->encoding_function;
  local_48 = &this->pass_on_byte;
  local_40 = &(this->remaining_bytes_buffer).actual_encoded_buffer_size;
  local_38 = output_buffer;
  do {
    iVar3 = local_80;
    if (local_58 <= local_80) {
      return local_80;
    }
    local_78 = (void *)0x0;
    iStack_70._M_current = (char *)0x0;
    local_68 = (char *)0x0;
    if ((this->encoded_buffer).cur_pos != (this->encoded_buffer).actual_encoded_buffer_size) {
      optional_ptr<duckdb::EncodingFunction,_true>::CheckValid(this_00);
      uVar8 = (this->encoded_buffer).actual_encoded_buffer_size - (this->encoded_buffer).cur_pos;
      if (uVar8 < ((this->encoding_function).ptr)->lookup_bytes) {
        for (; optional_ptr<duckdb::EncodingFunction,_true>::CheckValid(this_00),
            uVar8 < this_00->ptr->lookup_bytes; uVar8 = uVar8 + 1) {
          pcVar9 = (this->encoded_buffer).encoded_buffer._M_t.
                   super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                   super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                   super__Head_base<0UL,_char_*,_false>._M_head_impl + uVar8;
          if (iStack_70._M_current == local_68) {
            ::std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                      ((vector<char,std::allocator<char>> *)&local_78,iStack_70,pcVar9);
          }
          else {
            *iStack_70._M_current = *pcVar9;
            iStack_70._M_current = iStack_70._M_current + 1;
          }
        }
      }
    }
    local_60->cur_pos = 0;
    local_60->actual_encoded_buffer_size = 0;
    uVar8 = (long)iStack_70._M_current - (long)local_78;
    if (uVar8 != 0) {
      __n = 0;
      do {
        pvVar5 = vector<char,_true>::operator[]((vector<char,_true> *)&local_78,__n);
        (this->encoded_buffer).encoded_buffer._M_t.
        super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
        super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
        super__Head_base<0UL,_char_*,_false>._M_head_impl[__n] = *pvVar5;
        __n = __n + 1;
        uVar8 = (long)iStack_70._M_current - (long)local_78;
      } while (__n < uVar8);
    }
    if (this->has_pass_on_byte != false) {
      (this->encoded_buffer).encoded_buffer._M_t.
      super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
      super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
      super__Head_base<0UL,_char_*,_false>._M_head_impl[uVar8] = this->pass_on_byte;
    }
    uVar8 = FileHandle::Read(local_50,iStack_70._M_current +
                                      ((ulong)this->has_pass_on_byte - (long)local_78) +
                                      (long)(this->encoded_buffer).encoded_buffer._M_t.
                                            super___uniq_ptr_impl<char,_std::default_delete<char[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>
                                            .super__Head_base<0UL,_char_*,_false>._M_head_impl,
                             (this->encoded_buffer).encoded_buffer_size -
                             (long)(iStack_70._M_current +
                                   ((ulong)this->has_pass_on_byte - (long)local_78)));
    (this->encoded_buffer).actual_encoded_buffer_size =
         (ulong)this->has_pass_on_byte + ((long)iStack_70._M_current - (long)local_78) + uVar8;
    if (uVar8 < (this->encoded_buffer).encoded_buffer_size -
                ((long)iStack_70._M_current - (long)local_78)) {
LAB_00f3916a:
      (this->encoded_buffer).last_buffer = true;
      bVar7 = false;
    }
    else {
      iVar6 = FileHandle::Read(local_50,local_48,1);
      bVar7 = true;
      if (iVar6 == 0) goto LAB_00f3916a;
    }
    this->has_pass_on_byte = bVar7;
    optional_ptr<duckdb::EncodingFunction,_true>::CheckValid(this_00);
    pEVar1 = (this->encoding_function).ptr;
    (*pEVar1->encode_function)
              (local_60,local_38,&local_80,local_58,
               (this->remaining_bytes_buffer).encoded_buffer._M_t.
               super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
               super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
               super__Head_base<0UL,_char_*,_false>._M_head_impl,local_40,pEVar1);
    iVar4 = local_80;
    if (local_80 == iVar3) {
      unaff_R13 = local_80;
    }
    if (local_78 != (void *)0x0) {
      operator_delete(local_78);
    }
    if (iVar4 == iVar3) {
      return unaff_R13;
    }
  } while( true );
}

Assistant:

idx_t CSVEncoder::Encode(FileHandle &file_handle_input, char *output_buffer, const idx_t decoded_buffer_size) {
	idx_t output_buffer_pos = 0;
	// Check if we have some left-overs. These can either be
	// 1. missing decoded bytes
	if (remaining_bytes_buffer.HasDataToRead()) {
		D_ASSERT(remaining_bytes_buffer.cur_pos == 0);
		const auto remaining_bytes_buffer_ptr = remaining_bytes_buffer.Ptr();
		for (; remaining_bytes_buffer.cur_pos < remaining_bytes_buffer.GetSize(); remaining_bytes_buffer.cur_pos++) {
			output_buffer[output_buffer_pos++] = remaining_bytes_buffer_ptr[remaining_bytes_buffer.cur_pos];
		}
		remaining_bytes_buffer.Reset();
	}
	// 2. remaining encoded buffer
	if (encoded_buffer.HasDataToRead()) {
		encoding_function->GetFunction()(encoded_buffer, output_buffer, output_buffer_pos, decoded_buffer_size,
		                                 remaining_bytes_buffer.Ptr(),
		                                 remaining_bytes_buffer.actual_encoded_buffer_size, encoding_function.get());
	}
	// 3. a new encoded buffer from the file
	while (output_buffer_pos < decoded_buffer_size) {
		idx_t current_decoded_buffer_start = output_buffer_pos;
		vector<char> pass_on_buffer;
		if (encoded_buffer.cur_pos != encoded_buffer.GetSize() &&
		    encoding_function->GetLookupBytes() > encoded_buffer.GetSize() - encoded_buffer.cur_pos) {
			// We don't have enough lookup bytes for it, if that's the case, we need to set off these bytes to the next
			// buffer
			for (idx_t i = encoded_buffer.GetSize() - encoded_buffer.cur_pos; i < encoding_function->GetLookupBytes();
			     i++) {
				pass_on_buffer.push_back(encoded_buffer.Ptr()[i]);
			}
		}
		encoded_buffer.Reset();
		for (idx_t i = 0; i < pass_on_buffer.size(); i++) {
			encoded_buffer.Ptr()[i] = pass_on_buffer[i];
		}
		if (has_pass_on_byte) {
			encoded_buffer.Ptr()[pass_on_buffer.size()] = pass_on_byte;
		}
		auto actual_encoded_bytes = static_cast<idx_t>(
		    file_handle_input.Read(encoded_buffer.Ptr() + pass_on_buffer.size() + has_pass_on_byte,
		                           encoded_buffer.GetCapacity() - pass_on_buffer.size() - has_pass_on_byte));
		encoded_buffer.SetSize(actual_encoded_bytes + pass_on_buffer.size() + has_pass_on_byte);
		if (actual_encoded_bytes < encoded_buffer.GetCapacity() - pass_on_buffer.size()) {
			encoded_buffer.last_buffer = true;
			has_pass_on_byte = false;
		} else {
			auto bytes_read = static_cast<idx_t>(file_handle_input.Read(&pass_on_byte, 1));
			if (bytes_read == 0) {
				encoded_buffer.last_buffer = true;
				has_pass_on_byte = false;
			} else {
				has_pass_on_byte = true;
			}
		}
		encoding_function->GetFunction()(encoded_buffer, output_buffer, output_buffer_pos, decoded_buffer_size,
		                                 remaining_bytes_buffer.Ptr(),
		                                 remaining_bytes_buffer.actual_encoded_buffer_size, encoding_function.get());
		if (output_buffer_pos == current_decoded_buffer_start) {
			return output_buffer_pos;
		}
	}
	return output_buffer_pos;
}